

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O3

bool google::protobuf::compiler::cpp::IsFileDescriptorProto(FileDescriptor *file,Options *options)

{
  int iVar1;
  char *in_RCX;
  long lVar2;
  long lVar3;
  bool bVar4;
  string_view package;
  string local_c8;
  undefined1 local_a8 [80];
  AlphaNum local_58;
  
  package._M_str = in_RCX;
  package._M_len = **(size_t **)(file + 0x10);
  Namespace_abi_cxx11_(&local_c8,(cpp *)(*(size_t **)(file + 0x10))[1],package);
  local_58.piece_._M_len = 2;
  local_58.piece_._M_str = "::";
  bVar4 = options->opensource_runtime != false;
  local_a8[0x20] = '\x06';
  local_a8[0x21] = '\0';
  local_a8[0x22] = '\0';
  local_a8[0x23] = '\0';
  local_a8[0x24] = '\0';
  local_a8[0x25] = '\0';
  local_a8[0x26] = '\0';
  local_a8[0x27] = '\0';
  if (bVar4) {
    local_a8[0x20] = '\x10';
    local_a8[0x21] = '\0';
    local_a8[0x22] = '\0';
    local_a8[0x23] = '\0';
    local_a8[0x24] = '\0';
    local_a8[0x25] = '\0';
    local_a8[0x26] = '\0';
    local_a8[0x27] = '\0';
  }
  local_a8._40_8_ = "proto2";
  if (bVar4) {
    local_a8._40_8_ = "google::protobuf";
  }
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_a8,&local_58);
  if (local_c8._M_string_length == local_a8._8_8_) {
    if ((char *)local_c8._M_string_length == (char *)0x0) {
      bVar4 = false;
    }
    else {
      iVar1 = bcmp(local_c8._M_dataplus._M_p,(void *)local_a8._0_8_,local_c8._M_string_length);
      bVar4 = iVar1 != 0;
    }
  }
  else {
    bVar4 = true;
  }
  if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((bVar4) || (*(int *)(file + 0x3c) < 1)) {
    bVar4 = false;
  }
  else {
    lVar3 = 8;
    lVar2 = 0;
    do {
      iVar1 = std::__cxx11::string::compare(*(char **)(*(long *)(file + 0x60) + lVar3));
      bVar4 = iVar1 == 0;
      if (bVar4) {
        return bVar4;
      }
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x98;
    } while (lVar2 < *(int *)(file + 0x3c));
  }
  return bVar4;
}

Assistant:

bool IsFileDescriptorProto(const FileDescriptor* file, const Options& options) {
  if (Namespace(file, options) !=
      absl::StrCat("::", ProtobufNamespace(options))) {
    return false;
  }
  for (int i = 0; i < file->message_type_count(); ++i) {
    if (file->message_type(i)->name() == "FileDescriptorProto") return true;
  }
  return false;
}